

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::GetStatus(CPU *this)

{
  uint uVar1;
  ostream *poVar2;
  long *plVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cycles = ",9);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Program counter = ",0x12);
  *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18))
       & 0xffffffb5 | 8;
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,(uint)this->pc);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Stack pointer = ",0x10);
  *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18))
       & 0xffffffb5 | 8;
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,(uint)this->sp);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"memory.Read(pc) = ",0x12);
  *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18))
       & 0xffffffb5 | 8;
  uVar1 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar1 & 0xff);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"memory.Read(pc + 1) = ",0x16);
  *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18))
       & 0xffffffb5 | 8;
  uVar1 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)(*(int *)&this->pc + 1U & 0xffff))
  ;
  plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,uVar1 & 0xff);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"A = ",4);
  *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18))
       & 0xffffffb5 | 8;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)this->A);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," X = ",5);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)this->X);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," Y = ",5);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
  plVar3 = (long *)std::ostream::operator<<(poVar2,(uint)this->Y);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"C = ",4);
  *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash + *(long *)(std::cout + -0x18))
       & 0xffffffb5 | 8;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(this->field_6).ps & 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," Z = ",5);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->field_6).ps >> 1 & 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," I = ",5);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->field_6).ps >> 2 & 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," D = ",5);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->field_6).ps >> 3 & 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," B = ",5);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->field_6).ps >> 5 & 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," V = ",5);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->field_6).ps >> 6 & 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," N = ",5);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
  plVar3 = (long *)std::ostream::operator<<(poVar2,(uint)((this->field_6).ps >> 7));
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void CPU::GetStatus()
{
    // I'll leave this "as is" for now...
    std::cout << "Cycles = " << cycles << std::endl;
    std::cout << "Program counter = " << std::hex << (int)pc << std::endl;
    std::cout << "Stack pointer = " << std::hex << (int)sp << std::endl;
    std::cout << "memory.Read(pc) = " << std::hex << (int)memory.Read(pc) << std::endl;
    std::cout << "memory.Read(pc + 1) = " << std::hex << (int)memory.Read(pc + 1) << std::endl;
    std::cout << "A = " << std::hex << (int)A << " X = " << std::hex << (int)X << " Y = " << std::hex << (int)Y << std::endl;
    std::cout << "C = " << std::hex << (int)C << " Z = " << std::hex << (int)Z << " I = " << std::hex << (int)I << " D = " << std::hex << (int)D << " B = " << std::hex << (int)B << " V = " << std::hex << (int)V << " N = " << std::hex << (int)N << std::endl;
}